

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

size_t __thiscall std::hash<wasm::Field>::operator()(hash<wasm::Field> *this,Field *field)

{
  ulong uVar1;
  
  uVar1 = (field->type).id;
  uVar1 = (ulong)field->packedType + 0x9e3779b97f4a7c15 + (uVar1 >> 4) + uVar1 * 0x1000 ^ uVar1;
  return (uVar1 >> 4) + 0x9e3779b97f4a7c15 + uVar1 * 0x1000 + (ulong)field->mutable_ ^ uVar1;
}

Assistant:

size_t hash<wasm::Field>::operator()(const wasm::Field& field) const {
  auto digest = wasm::hash(field.type);
  wasm::rehash(digest, field.packedType);
  wasm::rehash(digest, field.mutable_);
  return digest;
}